

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

void __thiscall toml::Value::~Value(Value *this)

{
  void *pvVar1;
  undefined4 *in_RDI;
  vector<toml::Value,_std::allocator<toml::Value>_> *in_stack_ffffffffffffffe0;
  string *this_00;
  
  switch(*in_RDI) {
  case 4:
    this_00 = *(string **)(in_RDI + 2);
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string(this_00);
      operator_delete(this_00,0x20);
    }
    break;
  case 5:
    if (*(void **)(in_RDI + 2) != (void *)0x0) {
      operator_delete(*(void **)(in_RDI + 2),8);
    }
    break;
  case 6:
    pvVar1 = *(void **)(in_RDI + 2);
    if (pvVar1 != (void *)0x0) {
      std::vector<toml::Value,_std::allocator<toml::Value>_>::~vector(in_stack_ffffffffffffffe0);
      operator_delete(pvVar1,0x18);
    }
    break;
  case 7:
    pvVar1 = *(void **)(in_RDI + 2);
    if (pvVar1 != (void *)0x0) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
              *)0x22de3f);
      operator_delete(pvVar1,0x30);
    }
  }
  return;
}

Assistant:

inline Value::~Value()
{
    switch (type_) {
    case STRING_TYPE:
        delete string_;
        break;
    case TIME_TYPE:
        delete time_;
        break;
    case ARRAY_TYPE:
        delete array_;
        break;
    case TABLE_TYPE:
        delete table_;
        break;
    default:
        break;
    }
}